

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall QFutureInterfaceBase::suspendIfRequested(QFutureInterfaceBase *this)

{
  uint uVar1;
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  QFutureInterfaceBasePrivate *pQVar2;
  QFutureCallOutInterface *pQVar3;
  uint uVar4;
  QThreadPool *this_01;
  int i;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  ThreadPoolThreadReleaser releaser;
  QFutureCallOutEvent local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  uVar4 = (this_00->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar4 & 8) >> 3) != '\0' || (uVar4 & 0x30) == 0) goto LAB_003d9c3f;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar6 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar6) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar6) goto LAB_003d9b0c;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_003d9b0c:
  pQVar2 = this->d;
  uVar4 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar4 & 8) >> 3) == '\0' && (uVar4 & 0x30) != 0) {
    if ((uVar4 & 0x20) == 0) {
      uVar4 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i;
      do {
        LOCK();
        uVar1 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i;
        bVar6 = uVar4 == uVar1;
        if (bVar6) {
          (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i = uVar4 & 0xffffffcf | 0x20;
          uVar1 = uVar4;
        }
        uVar4 = uVar1;
        UNLOCK();
      } while (!bVar6);
      pQVar2 = this->d;
      QEvent::QEvent(&local_68.super_QEvent,FutureCallOut);
      local_68.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_006af620;
      local_68.callOutType = Suspended;
      local_68.index1 = -1;
      local_68.index2 = -1;
      local_68.text.d.d = (Data *)0x0;
      local_68.text.d.ptr = (char16_t *)0x0;
      local_68.text.d.size = 0;
      if ((pQVar2->outputConnections).d.size != 0) {
        uVar5 = 0;
        do {
          pQVar3 = (pQVar2->outputConnections).d.ptr[uVar5];
          (*pQVar3->_vptr_QFutureCallOutInterface[2])(pQVar3,&local_68);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)(pQVar2->outputConnections).d.size);
      }
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_68);
    }
    local_68.super_QEvent._vptr_QEvent = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = this->d->m_pool;
    if (this_01 == (QThreadPool *)0x0) {
      this_01 = QThreadPool::globalInstance();
    }
    local_68.super_QEvent._vptr_QEvent = (_func_int **)this_01;
    if (this_01 != (QThreadPool *)0x0) {
      QThreadPool::releaseThread(this_01);
    }
    QWaitCondition::wait(&this->d->pausedWaitCondition,this->d);
    anon_unknown.dwarf_11ff11d::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser
              ((ThreadPoolThreadReleaser *)&local_68);
  }
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
LAB_003d9c3f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::suspendIfRequested()
{
    const auto canSuspend = [] (int state) {
        // can suspend only if 1) in any suspend-related state; 2) not canceled
        return (state & suspendingOrSuspended) && !(state & Canceled);
    };

    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!canSuspend(state))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!canSuspend(state))
        return;

    // Note: expecting that Suspending and Suspended are mutually exclusive
    if (!(state & Suspended)) {
        // switch state in case this is the first invocation
        switch_from_to(d->state, Suspending, Suspended);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    }

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());
    d->pausedWaitCondition.wait(&d->m_mutex);
}